

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

Backend * pty_backend_create(Seat *seat,undefined8 param_2,Conf *conf,char **argv,long cmd,
                            char param_6,ulong param_7,ulong param_8,ulong param_9,ulong param_10,
                            ulong param_11,ulong param_12,ulong param_13,ulong param_14,
                            ulong param_15,ulong param_16,undefined8 param_17,ulong param_18)

{
  int *piVar1;
  Backend *pBVar2;
  char cVar3;
  tcflag_t tVar4;
  uint uVar5;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  __pid_t _Var9;
  uint uVar10;
  Pty *pty;
  long lVar11;
  Conf *pCVar12;
  ssize_t sVar13;
  size_t sVar14;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char **p;
  char *e;
  int *__pipedes;
  ulong uVar20;
  undefined8 *puVar21;
  PtyFd *e_00;
  ulong in_stack_00000108;
  int iStack0000000000000110;
  int iStack0000000000000114;
  int iStack0000000000000118;
  int iStack000000000000011c;
  int iStack0000000000000120;
  int iStack0000000000000124;
  int iStack0000000000000128;
  int iStack000000000000012c;
  int iStack0000000000000130;
  int iStack0000000000000134;
  undefined8 in_stack_00000138;
  int iStack0000000000000140;
  int iStack0000000000000144;
  undefined8 in_stack_00000150;
  undefined8 in_stack_00000180;
  int iStack0000000000000188;
  int iStack000000000000018c;
  int iStack0000000000000190;
  int iStack0000000000000194;
  int iStack0000000000000198;
  int iStack000000000000019c;
  int iStack00000000000001a0;
  int iStack00000000000001a4;
  int iStack00000000000001a8;
  int iStack00000000000001ac;
  int iStack00000000000001b0;
  int iStack00000000000001b4;
  undefined8 in_stack_000001d0;
  int iStack00000000000001d8;
  int iStack00000000000001dc;
  int iStack00000000000001e0;
  int iStack00000000000001e4;
  int iStack00000000000001e8;
  int iStack00000000000001ec;
  int iStack00000000000001f0;
  int iStack00000000000001f4;
  int in_stack_000001f8;
  int in_stack_000001fc;
  int in_stack_00000200;
  int in_stack_00000204;
  int in_stack_00000224;
  int in_stack_00000228;
  int in_stack_0000022c;
  int in_stack_00000230;
  int in_stack_00000234;
  int in_stack_00000238;
  int in_stack_00000274;
  int in_stack_00000278;
  int in_stack_0000027c;
  int in_stack_00000280;
  speed_t in_stack_0000050c;
  speed_t in_stack_00000510;
  char *in_stack_00000518;
  undefined8 *in_stack_00000520;
  termios attrs;
  char *key;
  
  (*seat->vt->set_trust_status)(seat,false);
  if (single_pty == (Pty *)0x0) {
    pty = new_pty_struct();
    pty->master_fd = -1;
    pty->slave_fd = -1;
    pty_stamped_utmp = 0;
  }
  else {
    pty = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  piVar1 = pty->pipefds;
  for (lVar11 = 4; lVar11 != 10; lVar11 = lVar11 + 1) {
    pty->pipefds[lVar11 + -4] = -1;
  }
  e_00 = pty->fds;
  for (lVar11 = 0x30; lVar11 != 0x60; lVar11 = lVar11 + 0x10) {
    *(undefined4 *)((long)pty->pipefds + lVar11 + -0x18) = 0xffffffff;
    *(Pty **)((long)pty->pipefds + lVar11 + -0x10) = pty;
  }
  if (pty_signal_pipe[0] < 0) {
    iVar7 = pipe(pty_signal_pipe);
    if (iVar7 < 0) {
      pcVar16 = "pterm: pipe";
      goto LAB_00112e09;
    }
    cloexec(pty_signal_pipe[0]);
    cloexec(pty_signal_pipe[1]);
  }
  pty->seat = seat;
  (pty->backend).vt = &pty_backend;
  pCVar12 = conf_copy(conf);
  pty->conf = pCVar12;
  iVar7 = conf_get_int(conf,0x7d);
  pty->term_width = iVar7;
  iVar7 = conf_get_int(conf,0x7e);
  pty->term_height = iVar7;
  if (ptyfds == (tree234 *)0x0) {
    ptyfds = newtree234(ptyfd_compare);
  }
  pBVar2 = &pty->backend;
  iVar7 = pty->master_fd;
  if (param_6 == '\0') {
    if (iVar7 < 0) {
      pty_open_master(pty);
    }
    if (-1 < pty_utmp_helper_pipe) {
      _Var6 = conf_get_bool(conf,0xc4);
      if (_Var6) {
        pcVar16 = (*pty->seat->vt->get_x_display)(pty->seat);
        sVar14 = strlen(pcVar16);
        iVar7 = (int)sVar14 + 1;
        uVar10 = 0;
        do {
          iVar8 = iVar7 - uVar10;
          if (iVar8 == 0 || iVar7 < (int)uVar10) goto LAB_00112b5c;
          sVar13 = write(pty_utmp_helper_pipe,pcVar16 + uVar10,(long)iVar8);
          uVar10 = uVar10 + (int)sVar13;
        } while (-1 < (int)sVar13);
        perror("pterm: writing to utmp helper process");
      }
      close(pty_utmp_helper_pipe);
      pty_utmp_helper_pipe = -1;
    }
LAB_00112b5c:
    iVar7 = pty->master_fd;
    pty->master_i = iVar7;
    pty->master_o = iVar7;
    pty->master_e = -1;
    pty->fds[0].fd = iVar7;
  }
  else {
    if ((-1 < iVar7) && (close(iVar7), -1 < pty_utmp_helper_pipe)) {
      close(pty_utmp_helper_pipe);
      pty_utmp_helper_pipe = -1;
    }
    uVar20 = 0xfffffffffffffffe;
    __pipedes = piVar1;
    while (uVar20 = uVar20 + 2, uVar20 < 6) {
      iVar7 = pipe(__pipedes);
      __pipedes = __pipedes + 2;
      if (iVar7 < 0) {
        (*pBVar2->vt->free)(pBVar2);
        return (Backend *)0x0;
      }
    }
    iVar7 = pty->pipefds[1];
    iVar8 = pty->pipefds[2];
    pty->master_i = iVar7;
    pty->fds[0].fd = iVar7;
    pty->master_o = iVar8;
    pty->fds[1].fd = iVar8;
    iVar7 = pty->pipefds[4];
    pty->master_e = iVar7;
    pty->fds[2].fd = iVar7;
    add234(ptyfds,e_00);
    add234(ptyfds,pty->fds + 1);
    e_00 = pty->fds + 2;
  }
  add234(ptyfds,e_00);
  pty_setup_sigchld_handler();
  _Var9 = fork();
  pcVar16 = pty_osx_envrestore_prefix;
  if (_Var9 < 0) {
    pcVar16 = "pterm: fork";
LAB_00112e09:
    perror(pcVar16 + 7);
    exit(1);
  }
  if (_Var9 != 0) {
    pty->child_pid = _Var9;
    pty->child_dead = false;
    pty->finished = false;
    if (0 < pty->slave_fd) {
      close(pty->slave_fd);
    }
    if (ptys_by_pid == (tree234 *)0x0) {
      ptys_by_pid = newtree234(pty_compare_by_pid);
    }
    if (-1 < *piVar1) {
      close(*piVar1);
      *piVar1 = -1;
    }
    if (-1 < pty->pipefds[3]) {
      close(pty->pipefds[3]);
      pty->pipefds[3] = -1;
    }
    if (-1 < pty->pipefds[5]) {
      close(pty->pipefds[5]);
      pty->pipefds[5] = -1;
    }
    add234(ptys_by_pid,pty);
    pty_uxsel_setup(pty);
    return pBVar2;
  }
  if (pty_osx_envrestore_prefix != (char *)0x0) {
    sVar14 = strlen(pty_osx_envrestore_prefix);
    sVar14 = (size_t)(int)sVar14;
    puVar21 = _environ;
    while (pcVar17 = (char *)*puVar21, pcVar17 != (char *)0x0) {
      iVar7 = strncmp(pcVar17,pcVar16,sVar14);
      puVar21 = puVar21 + 1;
      if (iVar7 == 0) {
        cVar3 = pcVar17[sVar14];
        sVar15 = strcspn(pcVar17,"=");
        pcVar16 = dupprintf("%.*s",sVar15 & 0xffffffff,pcVar17);
        sVar15 = strcspn(pcVar17,"=");
        pcVar17 = dupstr(pcVar17 + ((sVar15 + 1) - (ulong)(pcVar17[sVar15] == '\0')));
        if (cVar3 == 'u') {
          unsetenv(pcVar16 + sVar14 + 1);
        }
        else {
          setenv(pcVar16 + sVar14 + 1,pcVar17,1);
        }
        unsetenv(pcVar16);
        safefree(pcVar16);
        safefree(pcVar17);
        puVar21 = _environ;
        pcVar16 = pty_osx_envrestore_prefix;
      }
    }
  }
  _Var9 = getpid();
  if (param_6 == '\0') {
    iVar7 = pty->slave_fd;
    if (iVar7 < 0) {
      iVar7 = open(pty->name,2);
      pty->slave_fd = iVar7;
      cloexec(iVar7);
      iVar7 = pty->slave_fd;
      if (iVar7 < 0) {
        perror("slave pty: open");
        iVar7 = 1;
        goto LAB_00113b6f;
      }
    }
    close(pty->master_fd);
    noncloexec(iVar7);
    dup2(iVar7,0);
    dup2(iVar7,1);
    dup2(iVar7,2);
    close(iVar7);
    setsid();
    ioctl(0,0x540e,1);
    tcsetpgrp(0,_Var9);
    iVar7 = tcgetattr(0,(termios *)&attrs);
    if (iVar7 == 0) {
      _Var6 = conf_get_bool(conf,0x48);
      attrs.c_cc[2] = '\b';
      if (_Var6) {
        attrs.c_cc[2] = '\x7f';
      }
      _Var6 = (*seat->vt->is_utf8)(seat);
      uVar10 = (uint)_Var6 << 0xe | attrs.c_iflag & 0xffffbfff;
      if ((param_7 & 0x100) != 0) {
        iVar7 = 0;
        if (iStack0000000000000110 != 0xff) {
          iVar7 = iStack0000000000000110;
        }
        attrs.c_cc[0] = (cc_t)iVar7;
      }
      if ((param_7 & 0x10000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000114 != 0xff) {
          iVar7 = iStack0000000000000114;
        }
        attrs.c_cc[1] = (cc_t)iVar7;
      }
      if ((param_7 & 0x1000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000118 != 0xff) {
          iVar7 = iStack0000000000000118;
        }
        attrs.c_cc[2] = (cc_t)iVar7;
      }
      if ((param_7 & 0x100000000) != 0) {
        iVar7 = 0;
        if (iStack000000000000011c != 0xff) {
          iVar7 = iStack000000000000011c;
        }
        attrs.c_cc[3] = (cc_t)iVar7;
      }
      if ((param_7 & 0x10000000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000120 != 0xff) {
          iVar7 = iStack0000000000000120;
        }
        attrs.c_cc[4] = (cc_t)iVar7;
      }
      if ((param_7 & 0x1000000000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000124 != 0xff) {
          iVar7 = iStack0000000000000124;
        }
        attrs.c_cc[0xb] = (cc_t)iVar7;
      }
      if ((param_7 & 0x100000000000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000128 != 0xff) {
          iVar7 = iStack0000000000000128;
        }
        attrs.c_cc[0x10] = (cc_t)iVar7;
      }
      if ((param_8 & 1) != 0) {
        iVar7 = 0;
        if (iStack000000000000012c != 0xff) {
          iVar7 = iStack000000000000012c;
        }
        attrs.c_cc[8] = (cc_t)iVar7;
      }
      if ((param_8 & 0x100) != 0) {
        iVar7 = 0;
        if (iStack0000000000000130 != 0xff) {
          iVar7 = iStack0000000000000130;
        }
        attrs.c_cc[9] = (cc_t)iVar7;
      }
      if ((param_8 & 0x10000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000134 != 0xff) {
          iVar7 = iStack0000000000000134;
        }
        attrs.c_cc[10] = (cc_t)iVar7;
      }
      if ((param_8 & 0x100000000) != 0) {
        iVar7 = 0;
        if (in_stack_00000138._4_4_ != 0xff) {
          iVar7 = in_stack_00000138._4_4_;
        }
        attrs.c_cc[0xc] = (cc_t)iVar7;
      }
      if ((param_8 & 0x10000000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000140 != 0xff) {
          iVar7 = iStack0000000000000140;
        }
        attrs.c_cc[0xe] = (cc_t)iVar7;
      }
      if ((param_8 & 0x1000000000000) != 0) {
        iVar7 = 0;
        if (iStack0000000000000144 != 0xff) {
          iVar7 = iStack0000000000000144;
        }
        attrs.c_cc[0xf] = (cc_t)iVar7;
      }
      if ((param_9 & 0x10000) != 0) {
        iVar7 = 0;
        if (in_stack_00000150._4_4_ != 0xff) {
          iVar7 = in_stack_00000150._4_4_;
        }
        attrs.c_cc[0xd] = (cc_t)iVar7;
      }
      uVar5 = uVar10;
      if (((param_10 & 0x1000000000000) != 0) &&
         (uVar5 = (uint)_Var6 << 0xe | attrs.c_iflag & 0xffffbffb, in_stack_00000180._4_4_ != 0)) {
        uVar5 = uVar10 | 4;
      }
      attrs.c_iflag = uVar5;
      tVar4 = attrs.c_iflag;
      if (((param_10 & 0x100000000000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xfffffff7, iStack0000000000000188 != 0)) {
        tVar4 = attrs.c_iflag | 8;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 1) != 0) && (tVar4 = attrs.c_iflag & 0xffffffef, iStack000000000000018c != 0)
         ) {
        tVar4 = attrs.c_iflag | 0x10;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x100) != 0) &&
         (tVar4 = attrs.c_iflag & 0xffffffdf, iStack0000000000000190 != 0)) {
        tVar4 = attrs.c_iflag | 0x20;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x10000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xffffffbf, iStack0000000000000194 != 0)) {
        tVar4 = attrs.c_iflag | 0x40;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x1000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xffffff7f, iStack0000000000000198 != 0)) {
        tVar4 = attrs.c_iflag | 0x80;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x100000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xfffffeff, iStack000000000000019c != 0)) {
        tVar4 = attrs.c_iflag | 0x100;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x10000000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xfffffdff, iStack00000000000001a0 != 0)) {
        tVar4 = attrs.c_iflag | 0x200;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x1000000000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xfffffbff, iStack00000000000001a4 != 0)) {
        tVar4 = attrs.c_iflag | 0x400;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_11 & 0x100000000000000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xfffff7ff, iStack00000000000001a8 != 0)) {
        tVar4 = attrs.c_iflag | 0x800;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_12 & 1) != 0) && (tVar4 = attrs.c_iflag & 0xffffefff, iStack00000000000001ac != 0)
         ) {
        tVar4 = attrs.c_iflag | 0x1000;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_12 & 0x100) != 0) &&
         (tVar4 = attrs.c_iflag & 0xffffdfff, iStack00000000000001b0 != 0)) {
        tVar4 = attrs.c_iflag | 0x2000;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_iflag;
      if (((param_12 & 0x10000) != 0) &&
         (tVar4 = attrs.c_iflag & 0xffffbfff, iStack00000000000001b4 != 0)) {
        tVar4 = attrs.c_iflag | 0x4000;
      }
      attrs.c_iflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x10000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffffe, in_stack_000001d0._4_4_ != 0)) {
        tVar4 = attrs.c_lflag | 1;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x1000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffffd, iStack00000000000001d8 != 0)) {
        tVar4 = attrs.c_lflag | 2;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x100000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffffb, iStack00000000000001dc != 0)) {
        tVar4 = attrs.c_lflag | 4;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x10000000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffff7, iStack00000000000001e0 != 0)) {
        tVar4 = attrs.c_lflag | 8;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x1000000000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xffffffef, iStack00000000000001e4 != 0)) {
        tVar4 = attrs.c_lflag | 0x10;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_13 & 0x100000000000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xffffffdf, iStack00000000000001e8 != 0)) {
        tVar4 = attrs.c_lflag | 0x20;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 1) != 0) && (tVar4 = attrs.c_lflag & 0xffffffbf, iStack00000000000001ec != 0)
         ) {
        tVar4 = attrs.c_lflag | 0x40;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x100) != 0) &&
         (tVar4 = attrs.c_lflag & 0xffffff7f, iStack00000000000001f0 != 0)) {
        tVar4 = attrs.c_lflag | 0x80;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x10000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffeff, iStack00000000000001f4 != 0)) {
        tVar4 = attrs.c_lflag | 0x100;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x1000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xffff7fff, in_stack_000001f8 != 0)) {
        tVar4 = attrs.c_lflag | 0x8000;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x100000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffffdff, in_stack_000001fc != 0)) {
        tVar4 = attrs.c_lflag | 0x200;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x10000000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xfffff7ff, in_stack_00000200 != 0)) {
        tVar4 = attrs.c_lflag | 0x800;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_lflag;
      if (((param_14 & 0x1000000000000) != 0) &&
         (tVar4 = attrs.c_lflag & 0xffffbfff, in_stack_00000204 != 0)) {
        tVar4 = attrs.c_lflag | 0x4000;
      }
      attrs.c_lflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_15 & 0x1000000000000) != 0) &&
         (tVar4 = attrs.c_oflag & 0xfffffffe, in_stack_00000224 != 0)) {
        tVar4 = attrs.c_oflag | 1;
      }
      attrs.c_oflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_15 & 0x100000000000000) != 0) &&
         (tVar4 = attrs.c_oflag & 0xfffffffd, in_stack_00000228 != 0)) {
        tVar4 = attrs.c_oflag | 2;
      }
      attrs.c_oflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_16 & 1) != 0) && (tVar4 = attrs.c_oflag & 0xfffffffb, in_stack_0000022c != 0)) {
        tVar4 = attrs.c_oflag | 4;
      }
      attrs.c_oflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_16 & 0x100) != 0) && (tVar4 = attrs.c_oflag & 0xfffffff7, in_stack_00000230 != 0))
      {
        tVar4 = attrs.c_oflag | 8;
      }
      attrs.c_oflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_16 & 0x10000) != 0) &&
         (tVar4 = attrs.c_oflag & 0xffffffef, in_stack_00000234 != 0)) {
        tVar4 = attrs.c_oflag | 0x10;
      }
      attrs.c_oflag = tVar4;
      tVar4 = attrs.c_oflag;
      if (((param_16 & 0x1000000) != 0) &&
         (tVar4 = attrs.c_oflag & 0xffffffdf, in_stack_00000238 != 0)) {
        tVar4 = attrs.c_oflag | 0x20;
      }
      attrs.c_oflag = tVar4;
      if (((param_18 & 0x10000) != 0) &&
         (attrs.c_cflag = attrs.c_cflag & 0xffffffcf, in_stack_00000274 != 0)) {
        attrs.c_cflag = attrs.c_cflag | 0x20;
      }
      tVar4 = attrs.c_cflag;
      if (((param_18 & 0x1000000) != 0) &&
         (tVar4 = attrs.c_cflag & 0xffffffcf, in_stack_00000278 != 0)) {
        tVar4 = attrs.c_cflag | 0x30;
      }
      attrs.c_cflag = tVar4;
      tVar4 = attrs.c_cflag;
      if (((param_18 & 0x100000000) != 0) &&
         (tVar4 = attrs.c_cflag & 0xfffffeff, in_stack_0000027c != 0)) {
        tVar4 = attrs.c_cflag | 0x100;
      }
      attrs.c_cflag = tVar4;
      tVar4 = attrs.c_cflag;
      if (((param_18 & 0x10000000000) != 0) &&
         (tVar4 = attrs.c_cflag & 0xfffffdff, in_stack_00000280 != 0)) {
        tVar4 = attrs.c_cflag | 0x200;
      }
      attrs.c_cflag = tVar4;
      if ((in_stack_00000108 & 1) != 0) {
        cfsetispeed((termios *)&attrs,in_stack_0000050c);
      }
      if ((in_stack_00000108 & 0x100) != 0) {
        cfsetospeed((termios *)&attrs,in_stack_00000510);
      }
      tcsetattr(0,0,(termios *)&attrs);
    }
  }
  else {
    dup2(pty->pipefds[0],0);
    dup2(pty->pipefds[3],1);
    dup2(pty->pipefds[5],2);
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      close(piVar1[lVar11]);
    }
    setsid();
  }
  setpgid(_Var9,_Var9);
  if ((param_6 == '\0') && (iVar7 = open(pty->name,1,0), -1 < iVar7)) {
    close(iVar7);
  }
  setpgid(_Var9,_Var9);
  if (in_stack_00000520 != (undefined8 *)0x0) {
    for (; (char *)*in_stack_00000520 != (char *)0x0; in_stack_00000520 = in_stack_00000520 + 1) {
      unsetenv((char *)*in_stack_00000520);
    }
  }
  if (param_6 == '\0') {
    pcVar16 = conf_get_str(conf,0x35);
    pcVar16 = dupprintf("TERM=%s",pcVar16);
    putenv(pcVar16);
  }
  pcVar16 = (char *)0x0;
  while (pcVar16 = conf_get_str_strs(conf,0x38,pcVar16,&key), pcVar16 != (char *)0x0) {
    pcVar16 = dupcat_fn(key,"=",pcVar16,0);
    putenv(pcVar16);
    pcVar16 = key;
  }
  if (in_stack_00000518 != (char *)0x0) {
    chdir(in_stack_00000518);
  }
  putty_signal(2,(_func_void_int *)0x0);
  putty_signal(3,(_func_void_int *)0x0);
  putty_signal(0xd,(_func_void_int *)0x0);
  block_signal(0xd,false);
  if (argv == (char **)0x0 && cmd == 0) {
    pcVar17 = getenv("SHELL");
    pcVar16 = "/bin/sh";
    if (pcVar17 != (char *)0x0) {
      pcVar16 = pcVar17;
    }
    _Var6 = conf_get_bool(conf,0xc5);
    pcVar17 = pcVar16;
    if (_Var6) {
      pcVar18 = strrchr(pcVar16,0x2f);
      sVar14 = strlen(pcVar16);
      pcVar17 = (char *)safemalloc(sVar14 + 2,1,0);
      pcVar19 = pcVar18 + 1;
      if (pcVar18 == (char *)0x0) {
        pcVar19 = pcVar16;
      }
      sprintf(pcVar17,"-%s",pcVar19);
    }
    execl(pcVar16,pcVar17,0);
  }
  else {
    if (argv != (char **)0x0) {
      execvp(*argv,argv);
    }
    if ((cmd != 0) && (pcVar16 = getenv("SHELL"), pcVar16 != (char *)0x0)) {
      execl(pcVar16,pcVar16,"-c",cmd,0);
    }
  }
  perror("exec");
  iVar7 = 0x7f;
LAB_00113b6f:
  _exit(iVar7);
}

Assistant:

Backend *pty_backend_create(
    Seat *seat, LogContext *logctx, Conf *conf, char **argv, const char *cmd,
    struct ssh_ttymodes ttymodes, bool pipes_instead, const char *dir,
    const char *const *env_vars_to_unset)
{
    int slavefd;
    pid_t pid, pgrp;
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    bool got_windowid;
    long windowid;
#endif
    Pty *pty;
    int i;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    if (single_pty) {
        pty = single_pty;
        assert(pty->conf == NULL);
    } else {
        pty = new_pty_struct();
        pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
        pty_stamped_utmp = false;
#endif
    }
    for (i = 0; i < 6; i++)
        pty->pipefds[i] = -1;
    for (i = 0; i < 3; i++) {
        pty->fds[i].fd = -1;
        pty->fds[i].pty = pty;
    }

    if (pty_signal_pipe[0] < 0) {
        if (pipe(pty_signal_pipe) < 0) {
            perror("pipe");
            exit(1);
        }
        cloexec(pty_signal_pipe[0]);
        cloexec(pty_signal_pipe[1]);
    }

    pty->seat = seat;
    pty->backend.vt = &pty_backend;

    pty->conf = conf_copy(conf);
    pty->term_width = conf_get_int(conf, CONF_width);
    pty->term_height = conf_get_int(conf, CONF_height);

    if (!ptyfds)
        ptyfds = newtree234(ptyfd_compare);

    if (pipes_instead) {
        if (pty->master_fd >= 0) {
            /* If somehow we've got a pty master already and don't
             * need it, throw it away! */
            close(pty->master_fd);
#ifndef OMIT_UTMP
            if (pty_utmp_helper_pipe >= 0) {
                close(pty_utmp_helper_pipe); /* don't need this either */
                pty_utmp_helper_pipe = -1;
            }
#endif
        }


        for (i = 0; i < 6; i += 2) {
            if (pipe(pty->pipefds + i) < 0) {
                backend_free(&pty->backend);
                return NULL;
            }
        }

        pty->fds[0].fd = pty->master_i = pty->pipefds[1];
        pty->fds[1].fd = pty->master_o = pty->pipefds[2];
        pty->fds[2].fd = pty->master_e = pty->pipefds[4];

        add234(ptyfds, &pty->fds[0]);
        add234(ptyfds, &pty->fds[1]);
        add234(ptyfds, &pty->fds[2]);
    } else {
        if (pty->master_fd < 0)
            pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Stamp utmp (that is, tell the utmp helper process to do so),
         * or not.
         */
        if (pty_utmp_helper_pipe >= 0) {   /* if it's < 0, we can't anyway */
            if (!conf_get_bool(conf, CONF_stamp_utmp)) {
                /* We're not stamping utmp, so just let the child
                 * process die that was waiting to unstamp it later. */
                close(pty_utmp_helper_pipe);
                pty_utmp_helper_pipe = -1;
            } else {
                const char *location = seat_get_x_display(pty->seat);
                int len = strlen(location)+1, pos = 0; /* +1 to include NUL */
                while (pos < len) {
                    int ret = write(pty_utmp_helper_pipe,
                                    location + pos, len - pos);
                    if (ret < 0) {
                        perror("pterm: writing to utmp helper process");
                        close(pty_utmp_helper_pipe); /* arrgh, just give up */
                        pty_utmp_helper_pipe = -1;
                        break;
                    }
                    pos += ret;
                }
            }
        }
#endif

        pty->master_i = pty->master_fd;
        pty->master_o = pty->master_fd;
        pty->master_e = -1;

        pty->fds[0].fd = pty->master_fd;
        add234(ptyfds, &pty->fds[0]);
    }

#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    got_windowid = seat_get_windowid(pty->seat, &windowid);
#endif

    /*
     * Set up the signal handler to catch SIGCHLD, if pty_pre_init
     * didn't already do it.
     */
    pty_setup_sigchld_handler();

    /*
     * Fork and execute the command.
     */
    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    }

    if (pid == 0) {
        struct termios attrs;

        /*
         * We are the child.
         */

        if (pty_osx_envrestore_prefix) {
            int plen = strlen(pty_osx_envrestore_prefix);
            extern char **environ;
            char **ep;

          restart_osx_env_restore:
            for (ep = environ; *ep; ep++) {
                char *e = *ep;

                if (!strncmp(e, pty_osx_envrestore_prefix, plen)) {
                    bool unset = (e[plen] == 'u');
                    char *pname = dupprintf("%.*s", (int)strcspn(e, "="), e);
                    char *name = pname + plen + 1;
                    char *value = e + strcspn(e, "=");
                    if (*value) value++;
                    value = dupstr(value);
                    if (unset)
                        unsetenv(name);
                    else
                        setenv(name, value, 1);
                    unsetenv(pname);
                    sfree(pname);
                    sfree(value);
                    goto restart_osx_env_restore;
                }
            }
        }

        pgrp = getpid();

        if (pipes_instead) {
            int i;
            dup2(pty->pipefds[0], 0);
            dup2(pty->pipefds[3], 1);
            dup2(pty->pipefds[5], 2);
            for (i = 0; i < 6; i++)
                close(pty->pipefds[i]);

            setsid();
        } else {
            slavefd = pty_open_slave(pty);
            if (slavefd < 0) {
                perror("slave pty: open");
                _exit(1);
            }

            close(pty->master_fd);
            noncloexec(slavefd);
            dup2(slavefd, 0);
            dup2(slavefd, 1);
            dup2(slavefd, 2);
            close(slavefd);
            setsid();
#ifdef TIOCSCTTY
            ioctl(0, TIOCSCTTY, 1);
#endif
            tcsetpgrp(0, pgrp);

            /*
             * Set up configuration-dependent termios settings on the new
             * pty. Linux would have let us do this on the pty master
             * before we forked, but that fails on OS X, so we do it here
             * instead.
             */
            if (tcgetattr(0, &attrs) == 0) {
                /*
                 * Set the backspace character to be whichever of ^H and
                 * ^? is specified by bksp_is_delete.
                 */
                attrs.c_cc[VERASE] = conf_get_bool(conf, CONF_bksp_is_delete)
                    ? '\177' : '\010';

                /*
                 * Set the IUTF8 bit iff the character set is UTF-8.
                 */
#ifdef IUTF8
                if (seat_is_utf8(seat))
                    attrs.c_iflag |= IUTF8;
                else
                    attrs.c_iflag &= ~IUTF8;
#endif

                copy_ttymodes_into_termios(&attrs, ttymodes);

                tcsetattr(0, TCSANOW, &attrs);
            }
        }

        setpgid(pgrp, pgrp);
        if (!pipes_instead) {
            int ptyfd = open(pty->name, O_WRONLY, 0);
            if (ptyfd >= 0)
                close(ptyfd);
        }
        setpgid(pgrp, pgrp);

        if (env_vars_to_unset)
            for (const char *const *p = env_vars_to_unset; *p; p++)
                unsetenv(*p);

        if (!pipes_instead) {
            char *term_env_var = dupprintf("TERM=%s",
                                           conf_get_str(conf, CONF_termtype));
            putenv(term_env_var);
            /* We mustn't free term_env_var, as putenv links it into the
             * environment in place.
             */
        }
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
        if (got_windowid) {
            char *windowid_env_var = dupprintf("WINDOWID=%ld", windowid);
            putenv(windowid_env_var);
            /* We mustn't free windowid_env_var, as putenv links it into the
             * environment in place.
             */
        }
        {
            /*
             * In case we were invoked with a --display argument that
             * doesn't match DISPLAY in our actual environment, we
             * should set DISPLAY for processes running inside the
             * terminal to match the display the terminal itself is
             * on.
             */
            const char *x_display = seat_get_x_display(pty->seat);
            if (x_display) {
                char *x_display_env_var = dupprintf("DISPLAY=%s", x_display);
                putenv(x_display_env_var);
                /* As above, we don't free this. */
            } else {
                unsetenv("DISPLAY");
            }
        }
#endif
        {
            char *key, *val;

            for (val = conf_get_str_strs(conf, CONF_environmt, NULL, &key);
                 val != NULL;
                 val = conf_get_str_strs(conf, CONF_environmt, key, &key)) {
                char *varval = dupcat(key, "=", val);
                putenv(varval);
                /*
                 * We must not free varval, since putenv links it
                 * into the environment _in place_. Weird, but
                 * there we go. Memory usage will be rationalised
                 * as soon as we exec anyway.
                 */
            }
        }

        if (dir) {
            if (chdir(dir) < 0) {
                /* Ignore the error - nothing we can sensibly do about it,
                 * and our existing cwd is as good a fallback as any. */
            }
        }

        /*
         * SIGINT, SIGQUIT and SIGPIPE may have been set to ignored by
         * our parent, particularly by things like sh -c 'pterm &' and
         * some window or session managers. SIGPIPE was also
         * (potentially) blocked by us during startup. Reverse all
         * this for our child process.
         */
        putty_signal(SIGINT, SIG_DFL);
        putty_signal(SIGQUIT, SIG_DFL);
        putty_signal(SIGPIPE, SIG_DFL);
        block_signal(SIGPIPE, false);
        if (argv || cmd) {
            /*
             * If we were given a separated argument list, try to exec
             * it.
             */
            if (argv) {
                execvp(argv[0], argv);
            }
            /*
             * Otherwise, if we were given a single command string,
             * try passing that to $SHELL -c.
             *
             * In the case of pterm, this system of fallbacks arranges
             * that we can _either_ follow 'pterm -e' with a list of
             * argv elements to be fed directly to exec, _or_ with a
             * single argument containing a command to be parsed by a
             * shell (but, in cases of doubt, the former is more
             * reliable). We arrange this by setting argv to the full
             * argument list, and also setting cmd to the single
             * element of argv if it's a length-1 list.
             *
             * A quick survey of other terminal emulators' -e options
             * (as of Debian squeeze) suggests that:
             *
             *  - xterm supports both modes, more or less like this
             *  - gnome-terminal will only accept a one-string shell command
             *  - Eterm, kterm and rxvt will only accept a list of
             *    argv elements (as did older versions of pterm).
             *
             * It therefore seems important to support both usage
             * modes in order to be a drop-in replacement for either
             * xterm or gnome-terminal, and hence for anyone's
             * plausible uses of the Debian-style alias
             * 'x-terminal-emulator'.
             *
             * In other use cases, a caller can set only one of argv
             * and cmd to get a fixed handling of the input.
             */
            if (cmd) {
                char *shell = getenv("SHELL");
                if (shell)
                    execl(shell, shell, "-c", cmd, (void *)NULL);
            }
        } else {
            const char *shell = getenv("SHELL");
            if (!shell)
                shell = "/bin/sh";
            char *shellname;
            if (conf_get_bool(conf, CONF_login_shell)) {
                const char *p = strrchr(shell, '/');
                shellname = snewn(2+strlen(shell), char);
                p = p ? p+1 : shell;
                sprintf(shellname, "-%s", p);
            } else
                shellname = (char *)shell;
            execl(shell, shellname, (void *)NULL);
        }

        /*
         * If we're here, exec has gone badly foom.
         */
        perror("exec");
        _exit(127);
    } else {
        pty->child_pid = pid;
        pty->child_dead = false;
        pty->finished = false;
        if (pty->slave_fd > 0)
            close(pty->slave_fd);
        if (!ptys_by_pid)
            ptys_by_pid = newtree234(pty_compare_by_pid);
        if (pty->pipefds[0] >= 0) {
            close(pty->pipefds[0]);
            pty->pipefds[0] = -1;
        }
        if (pty->pipefds[3] >= 0) {
            close(pty->pipefds[3]);
            pty->pipefds[3] = -1;
        }
        if (pty->pipefds[5] >= 0) {
            close(pty->pipefds[5]);
            pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid, pty);
    }

    pty_uxsel_setup(pty);

    return &pty->backend;
}